

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O2

void ncnn::gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  uint uVar18;
  uint uVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  void *local_88;
  
  iVar15 = grid->h * grid->w;
  piVar11 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    sVar4 = grid->cstep;
    sVar5 = grid->elemsize;
    local_88 = grid->data;
    for (lVar10 = 0; lVar10 < grid->c; lVar10 = lVar10 + 1) {
      for (lVar12 = 0; (int)lVar12 < iVar15; lVar12 = lVar12 + 2) {
        uVar1 = *(undefined8 *)((long)local_88 + lVar12 * 4);
        uVar3 = src->w;
        uVar8 = src->h;
        fVar17 = floorf(((float)uVar1 * 0.5 + 0.5) * (float)(int)uVar3);
        fVar16 = floorf(((float)((ulong)uVar1 >> 0x20) * 0.5 + 0.5) * (float)(int)uVar8);
        uVar9 = (uint)fVar17;
        uVar18 = (uint)fVar16;
        auVar20._4_4_ = -(uint)((int)uVar9 < (int)uVar3);
        auVar20._0_4_ = -(uint)((int)uVar9 < (int)uVar3);
        auVar20._8_4_ = -(uint)((int)uVar18 < (int)uVar8);
        auVar20._12_4_ = -(uint)((int)uVar18 < (int)uVar8);
        iVar13 = -1;
        iVar14 = (uVar3 * uVar18 + uVar9) * src->elempack;
        if ((int)(uVar18 | uVar9) < 0) {
          iVar14 = iVar13;
        }
        uVar9 = movmskpd(uVar9,auVar20);
        if ((uVar9 & 1) == 0) {
          iVar14 = iVar13;
        }
        if ((uVar9 & 2) == 0) {
          iVar14 = iVar13;
        }
        *piVar11 = iVar14;
        piVar11 = piVar11 + 1;
      }
      local_88 = (void *)((long)local_88 + sVar4 * sVar5);
    }
  }
  else {
    sVar4 = grid->elemsize;
    sVar5 = grid->cstep;
    pvVar6 = grid->data;
    lVar10 = 0;
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    for (; iVar15 != (int)lVar10; lVar10 = lVar10 + 1) {
      uVar2 = src->w;
      uVar7 = src->h;
      fVar17 = *(float *)((long)pvVar6 + lVar10 * 4 + sVar4 * sVar5);
      fVar16 = floorf((*(float *)((long)pvVar6 + lVar10 * 4) * 0.5 + 0.5) * (float)(int)uVar2);
      fVar17 = floorf((fVar17 * 0.5 + 0.5) * (float)(int)uVar7);
      uVar18 = (uint)fVar16;
      uVar21 = (uint)fVar17;
      auVar19._4_4_ = -(uint)((int)uVar18 < (int)uVar2);
      auVar19._0_4_ = -(uint)((int)uVar18 < (int)uVar2);
      auVar19._8_4_ = -(uint)((int)uVar21 < (int)uVar7);
      auVar19._12_4_ = -(uint)((int)uVar21 < (int)uVar7);
      uVar9 = movmskpd(uVar18,auVar19);
      iVar13 = -1;
      iVar14 = (uVar2 * uVar21 + uVar18) * src->elempack;
      if ((int)(uVar21 | uVar18) < 0) {
        iVar14 = iVar13;
      }
      if ((uVar9 & 1) == 0) {
        iVar14 = iVar13;
      }
      if ((uVar9 & 2) == 0) {
        iVar14 = iVar13;
      }
      piVar11[lVar10] = iVar14;
    }
  }
  return;
}

Assistant:

void gridsample_2d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 16;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

                gridptr += 2;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;

            offset_ptr++;
        }
    }
}